

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O1

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info
          (dwarf_resolver *this,die_object *cu_die,Dwarf_Addr pc,stacktrace_frame *frame)

{
  _func_int *p_Var1;
  Dwarf_Line pDVar2;
  Dwarf_Line line;
  size_type __len1;
  _func_int *p_Var3;
  cache_mode cVar4;
  int iVar5;
  size_t __len2;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  _func_int *p_Var9;
  long lVar10;
  Dwarf_Line line_00;
  long lVar11;
  source_location location;
  Dwarf_Error in_stack_ffffffffffffff38;
  Dwarf_Error pDVar12;
  Dwarf_Error local_b0;
  Dwarf_Addr local_a8;
  stacktrace_frame *local_a0;
  Dwarf_Signed local_98;
  ulong local_90;
  Dwarf_Addr local_88;
  Dwarf_Addr local_80;
  Dwarf_Line local_78;
  long local_70;
  long local_68;
  char *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  Dwarf_Signed local_50;
  Dwarf_Line *local_48;
  symbol_resolver local_40;
  char local_38;
  
  for (; (this->skeleton).holds_value == true; this = (this->skeleton).field_0.uvalue.resolver) {
  }
  local_a0 = frame;
  get_line_table((dwarf_resolver *)&stack0xffffffffffffffc0,(die_object *)this);
  if (local_38 == '\x01') {
    cVar4 = get_cache_mode();
    if (cVar4 == prioritize_speed) {
      p_Var1 = local_40._vptr_symbol_resolver[2];
      uVar7 = (long)local_40._vptr_symbol_resolver[3] - (long)p_Var1;
      p_Var9 = p_Var1;
      if (0 < (long)uVar7) {
        uVar7 = (uVar7 >> 3) * -0x71c71c71c71c71c7;
        do {
          uVar8 = uVar7 >> 1;
          uVar7 = ~uVar8 + uVar7;
          p_Var3 = p_Var9 + uVar8 * 0x48 + 0x48;
          if (pc < *(ulong *)(p_Var9 + uVar8 * 0x48)) {
            uVar7 = uVar8;
            p_Var3 = p_Var9;
          }
          p_Var9 = p_Var3;
        } while (0 < (long)uVar7);
      }
      if (p_Var9 + -0x48 != local_40._vptr_symbol_resolver[3] && p_Var9 != p_Var1) {
        pDVar2 = *(Dwarf_Line *)(p_Var9 + -0x40);
        if (p_Var9[-0xc] == (_func_int)0x0) {
          local_b0 = (Dwarf_Error)0x0;
          in_stack_ffffffffffffff38 = (Dwarf_Error)0x0;
          iVar5 = dwarf_lineno(pDVar2,(Dwarf_Unsigned *)&local_b0,
                               (Dwarf_Error *)&stack0xffffffffffffff38);
          if (iVar5 == 1) {
            handle_dwarf_error(this->dbg,in_stack_ffffffffffffff38);
          }
          if (iVar5 != 0) {
            assert_fail((detail *)0x1,0x1d9a92,
                        "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                        ,(source_location)ZEXT816(0x2eb),(char *)in_stack_ffffffffffffff38);
          }
          *(undefined4 *)(p_Var9 + -0x10) = local_b0._0_4_;
          p_Var9[-0xc] = (code)0x1;
        }
        pcVar6 = "T &cpptrace::detail::optional<unsigned int>::unwrap() & [T = unsigned int]";
        if (p_Var9[-0xc] == (_func_int)0x1) {
          (local_a0->line).raw_value = *(uint *)(p_Var9 + -0x10);
          if (p_Var9[-4] == (_func_int)0x0) {
            local_b0 = (Dwarf_Error)0x0;
            in_stack_ffffffffffffff38 = (Dwarf_Error)0x0;
            iVar5 = dwarf_lineoff_b(pDVar2,(Dwarf_Unsigned *)&local_b0,
                                    (Dwarf_Error *)&stack0xffffffffffffff38);
            if (iVar5 == 1) {
              handle_dwarf_error(this->dbg,in_stack_ffffffffffffff38);
            }
            if (iVar5 != 0) {
              assert_fail((detail *)0x1,0x1d9b3e,
                          "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                          ,(source_location)ZEXT816(0x2f2),(char *)in_stack_ffffffffffffff38);
            }
            *(undefined4 *)(p_Var9 + -8) = local_b0._0_4_;
            p_Var9[-4] = (code)0x1;
          }
          if (p_Var9[-4] == (_func_int)0x1) {
            (local_a0->column).raw_value = *(uint *)(p_Var9 + -8);
            if (p_Var9[-0x18] == (_func_int)0x0) {
              local_b0 = (Dwarf_Error)0x0;
              pDVar12 = (Dwarf_Error)0x0;
              iVar5 = dwarf_linesrc(pDVar2,(char **)&local_b0,
                                    (Dwarf_Error *)&stack0xffffffffffffff38);
              if (iVar5 == 1) {
                handle_dwarf_error(this->dbg,pDVar12);
              }
              if (iVar5 != 0) {
                assert_fail((detail *)0x1,0x1d9b77,
                            "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                            ,(source_location)ZEXT816(0x2f9),(char *)pDVar12);
              }
              in_stack_ffffffffffffff38 = local_b0;
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ::operator=<char_*&,_0>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          *)(p_Var9 + -0x38),(char **)&local_b0);
              raii_wrapper<char_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:764:29),_0,_0,_0>
              ::~raii_wrapper((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O1__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:764:29),_0,_0,_0>
                               *)&stack0xffffffffffffff38);
            }
            if (p_Var9[-0x18] != (_func_int)0x0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&local_a0->filename,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var9 + -0x38));
              return;
            }
            pcVar6 = 
            "T &cpptrace::detail::optional<std::basic_string<char>>::unwrap() & [T = std::basic_string<char>]"
            ;
          }
        }
        location._8_8_ = "Optional does not contain a value";
        location.file = (char *)0x12b;
        assert_fail((detail *)0x0,0x1d8c98,pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/utils/utils.hpp"
                    ,location,(char *)in_stack_ffffffffffffff38);
      }
    }
    else {
      local_b0 = (Dwarf_Error)0x0;
      local_98 = 0;
      local_48 = (Dwarf_Line *)0x0;
      local_50 = 0;
      pDVar12 = (Dwarf_Error)0x0;
      iVar5 = dwarf_srclines_two_level_from_linecontext
                        ((Dwarf_Line_Context)local_40._vptr_symbol_resolver[1],
                         (Dwarf_Line **)&local_b0,&local_98,&local_48,&local_50,
                         (Dwarf_Error *)&stack0xffffffffffffff38);
      if (iVar5 == 1) {
        handle_dwarf_error(this->dbg,pDVar12);
      }
      if (iVar5 != 0) {
        assert_fail((detail *)0x1,0x1d9ba9,
                    "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                    ,(source_location)ZEXT816(0x312),(char *)pDVar12);
      }
      if (0 < local_98) {
        local_58 = &local_a0->filename;
        lVar10 = 1;
        lVar11 = 0;
        local_78 = (Dwarf_Line)0x0;
        local_90 = 0;
        local_88 = pc;
        do {
          pDVar2 = (Dwarf_Line)(&local_b0->er_errval)[lVar11];
          local_80 = 0;
          pDVar12 = (Dwarf_Error)0x0;
          iVar5 = dwarf_lineaddr(pDVar2,&local_80,(Dwarf_Error *)&stack0xffffffffffffff38);
          if (iVar5 == 1) {
            handle_dwarf_error(this->dbg,pDVar12);
          }
          if (iVar5 != 0) {
            assert_fail((detail *)0x1,0x1d9c37,
                        "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                        ,(source_location)ZEXT816(0x318),(char *)pDVar12);
          }
          local_70 = lVar10;
          local_68 = lVar11;
          if (local_80 == pc) {
            line_00 = pDVar2;
            if (lVar11 + 1 < local_98) {
              do {
                line = (Dwarf_Line)(&local_b0->er_errval)[lVar10];
                local_a8 = 0;
                pDVar12 = (Dwarf_Error)0x0;
                iVar5 = dwarf_lineaddr(line,&local_a8,(Dwarf_Error *)&stack0xffffffffffffff38);
                if (iVar5 == 1) {
                  handle_dwarf_error(this->dbg,pDVar12);
                }
                if (iVar5 != 0) {
                  assert_fail((detail *)0x1,0x1d9c37,
                              "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                              ,(source_location)ZEXT816(800),(char *)pDVar12);
                }
                if (local_a8 == local_88) {
                  line_00 = line;
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 < local_98);
            }
          }
          else {
            line_00 = (Dwarf_Line)0x0;
            if (pc < local_80) {
              line_00 = local_78;
            }
            if (pc <= local_90) {
              line_00 = (Dwarf_Line)0x0;
            }
            if (local_78 == (Dwarf_Line)0x0) {
              line_00 = local_78;
            }
          }
          if (line_00 == (Dwarf_Line)0x0) {
            pDVar12 = (Dwarf_Error)0x0;
            iVar5 = dwarf_lineendsequence
                              (pDVar2,(Dwarf_Bool *)&local_a8,
                               (Dwarf_Error *)&stack0xffffffffffffff38);
            if (iVar5 == 1) {
              handle_dwarf_error(this->dbg,pDVar12);
            }
            if (iVar5 != 0) {
              assert_fail((detail *)0x1,0x1d9cdc,
                          "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                          ,(source_location)ZEXT816(0x336),(char *)pDVar12);
            }
            pc = local_88;
            lVar11 = local_68;
            if ((uint)local_a8 == 0) {
              local_90 = local_80;
              local_78 = pDVar2;
            }
            else {
              local_90 = 0;
              local_78 = (Dwarf_Line)0x0;
            }
          }
          else {
            local_a8 = 0;
            pDVar12 = (Dwarf_Error)0x0;
            iVar5 = dwarf_lineno(line_00,&local_a8,(Dwarf_Error *)&stack0xffffffffffffff38);
            lVar11 = local_68;
            pc = local_88;
            if (iVar5 == 1) {
              handle_dwarf_error(this->dbg,pDVar12);
            }
            if (iVar5 != 0) {
              assert_fail((detail *)0x1,0x1d9c6a,
                          "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                          ,(source_location)ZEXT816(0x32b),(char *)pDVar12);
            }
            (local_a0->line).raw_value = (uint)local_a8;
            local_60 = (char *)0x0;
            pDVar12 = (Dwarf_Error)0x0;
            iVar5 = dwarf_linesrc(line_00,&local_60,(Dwarf_Error *)&stack0xffffffffffffff38);
            pcVar6 = local_60;
            if (iVar5 == 1) {
              handle_dwarf_error(this->dbg,pDVar12);
            }
            if (iVar5 != 0) {
              assert_fail((detail *)0x1,0x1d9ca4,
                          "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                          ,(source_location)ZEXT816(0x32e),(char *)pDVar12);
            }
            __len1 = (local_a0->filename)._M_string_length;
            __len2 = strlen(local_60);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(local_58,0,__len1,pcVar6,__len2);
            raii_wrapper<char_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:817:29),_0,_0,_0>
            ::~raii_wrapper((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O1__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:817:29),_0,_0,_0>
                             *)&stack0xffffffffffffff38);
          }
          lVar11 = lVar11 + 1;
          lVar10 = local_70 + 1;
        } while (lVar11 < local_98);
      }
    }
  }
  return;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        void retrieve_line_info(
            const die_object& cu_die,
            Dwarf_Addr pc,
            stacktrace_frame& frame
        ) {
            // For debug fission the skeleton debug info will have the line table
            if(skeleton) {
                return skeleton.unwrap().resolver.retrieve_line_info(skeleton.unwrap().cu_die, pc, frame);
            }
            auto table_info_opt = get_line_table(cu_die);
            if(!table_info_opt) {
                return; // failing silently for now
            }
            auto& table_info = table_info_opt.unwrap().get();
            if(get_cache_mode() == cache_mode::prioritize_speed) {
                // Lookup in the table
                auto& line_entries = table_info.line_entries;
                auto table_it = first_less_than_or_equal(
                    line_entries.begin(),
                    line_entries.end(),
                    pc,
                    [] (Dwarf_Addr pc, const line_entry& entry) {
                        return pc < entry.low;
                    }
                );
                // If the vector has been empty this can happen
                if(table_it != line_entries.end()) {
                    Dwarf_Line line = table_it->line;
                    // line number
                    if(!table_it->line_number) {
                        Dwarf_Unsigned line_number = 0;
                        VERIFY(wrap(dwarf_lineno, line, &line_number) == DW_DLV_OK);
                        table_it->line_number = static_cast<std::uint32_t>(line_number);
                    }
                    frame.line = table_it->line_number.unwrap();
                    // column number
                    if(!table_it->column_number) {
                        Dwarf_Unsigned column_number = 0;
                        VERIFY(wrap(dwarf_lineoff_b, line, &column_number) == DW_DLV_OK);
                        table_it->column_number = static_cast<std::uint32_t>(column_number);
                    }
                    frame.column = table_it->column_number.unwrap();
                    // filename
                    if(!table_it->path) {
                        char* filename = nullptr;
                        VERIFY(wrap(dwarf_linesrc, line, &filename) == DW_DLV_OK);
                        auto wrapper = raii_wrap(
                            filename,
                            [this] (char* str) { if(str) dwarf_dealloc(dbg, str, DW_DLA_STRING); }
                        );
                        table_it->path = filename;
                    }
                    frame.filename = table_it->path.unwrap();
                }
            } else {
                Dwarf_Line_Context line_context = table_info.line_context;
                // walk for it
                Dwarf_Line* line_buffer = nullptr;
                Dwarf_Signed line_count = 0;
                Dwarf_Line* linebuf_actuals = nullptr;
                Dwarf_Signed linecount_actuals = 0;
                VERIFY(
                    wrap(
                        dwarf_srclines_two_level_from_linecontext,
                        line_context,
                        &line_buffer,
                        &line_count,
                        &linebuf_actuals,
                        &linecount_actuals
                    ) == DW_DLV_OK
                );
                Dwarf_Addr last_lineaddr = 0;
                Dwarf_Line last_line = nullptr;
                for(int i = 0; i < line_count; i++) {
                    Dwarf_Line line = line_buffer[i];
                    Dwarf_Addr lineaddr = 0;
                    VERIFY(wrap(dwarf_lineaddr, line, &lineaddr) == DW_DLV_OK);
                    Dwarf_Line found_line = nullptr;
                    if(pc == lineaddr) {
                        // Multiple PCs may correspond to a line, find the last one
                        found_line = line;
                        for(int j = i + 1; j < line_count; j++) {
                            Dwarf_Line line = line_buffer[j];
                            Dwarf_Addr lineaddr = 0;
                            VERIFY(wrap(dwarf_lineaddr, line, &lineaddr) == DW_DLV_OK);
                            if(pc == lineaddr) {
                                found_line = line;
                            }
                        }
                    } else if(last_line && pc > last_lineaddr && pc < lineaddr) {
                        // Guess that the last line had it
                        found_line = last_line;
                    }
                    if(found_line) {
                        Dwarf_Unsigned line_number = 0;
                        VERIFY(wrap(dwarf_lineno, found_line, &line_number) == DW_DLV_OK);
                        frame.line = static_cast<std::uint32_t>(line_number);
                        char* filename = nullptr;
                        VERIFY(wrap(dwarf_linesrc, found_line, &filename) == DW_DLV_OK);
                        auto wrapper = raii_wrap(
                            filename,
                            [this] (char* str) { if(str) dwarf_dealloc(dbg, str, DW_DLA_STRING); }
                        );
                        frame.filename = filename;
                    } else {
                        Dwarf_Bool is_line_end;
                        VERIFY(wrap(dwarf_lineendsequence, line, &is_line_end) == DW_DLV_OK);
                        if(is_line_end) {
                            last_lineaddr = 0;
                            last_line = nullptr;
                        } else {
                            last_lineaddr = lineaddr;
                            last_line = line;
                        }
                    }
                }
            }
        }